

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mc.cpp
# Opt level: O2

void __thiscall spatial_region::pmerging(spatial_region *this,double *ppd,string *pmerging)

{
  double *pdVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  cellp ***pppcVar5;
  particle *ppVar6;
  particle *ppVar7;
  particle *ppVar8;
  undefined1 auVar9 [16];
  bool bVar10;
  uint uVar11;
  uint uVar12;
  double *pdVar13;
  double *pdVar14;
  double *pdVar15;
  double *pdVar16;
  uint uVar17;
  ulong uVar18;
  particle **pppVar19;
  long lVar20;
  double *pdVar21;
  double *pdVar22;
  int ii;
  double *pdVar23;
  ulong uVar24;
  particle *ppVar25;
  uint uVar26;
  double *pdVar27;
  int j;
  ulong uVar28;
  int k;
  ulong uVar29;
  int ii_1;
  ulong uVar30;
  int k_3;
  long lVar31;
  int i;
  cellp *pcVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [64];
  double local_90;
  double local_88;
  
  uVar12 = this->n_ion_populations;
  uVar11 = uVar12 + 3;
  uVar18 = (long)(int)uVar11 * 8;
  if ((int)uVar12 < -3) {
    uVar18 = 0xffffffffffffffff;
  }
  pdVar13 = (double *)operator_new__(uVar18);
  pdVar14 = (double *)operator_new__(uVar18);
  for (uVar18 = 0; (~((int)uVar11 >> 0x1f) & uVar11) != uVar18; uVar18 = uVar18 + 1) {
    pdVar13[uVar18] = 0.0;
    pdVar14[uVar18] = 0.0;
  }
  uVar11 = this->nz;
  uVar26 = this->ny;
  uVar17 = this->nx;
  pdVar1 = pdVar14 + 2;
  pdVar27 = pdVar14 + 1;
  pppcVar5 = (this->cp).p._M_t.super___uniq_ptr_impl<cellp_**,_std::default_delete<cellp_**[]>_>.
             _M_t.super__Tuple_impl<0UL,_cellp_***,_std::default_delete<cellp_**[]>_>.
             super__Head_base<0UL,_cellp_***,_false>._M_head_impl;
  pdVar15 = this->icmr;
  uVar18 = 0;
  do {
    if (uVar18 == (~((int)uVar17 >> 0x1f) & uVar17)) {
      bVar10 = std::operator==(pmerging,"ti");
      if (bVar10) {
        for (lVar33 = 0; uVar12 = this->nx, lVar33 < (int)uVar12; lVar33 = lVar33 + 1) {
          for (lVar20 = 0; lVar20 < this->ny; lVar20 = lVar20 + 1) {
            for (lVar31 = 0; lVar31 < this->nz; lVar31 = lVar31 + 1) {
              ppVar6 = (this->cp).p._M_t.
                       super___uniq_ptr_impl<cellp_**,_std::default_delete<cellp_**[]>_>._M_t.
                       super__Tuple_impl<0UL,_cellp_***,_std::default_delete<cellp_**[]>_>.
                       super__Head_base<0UL,_cellp_***,_false>._M_head_impl[lVar33][lVar20][lVar31].
                       pl.head;
              while (ppVar25 = ppVar6, ppVar25 != (particle *)0x0) {
                dVar36 = get_rand(this);
                ppVar6 = ppVar25->next;
                if (dVar36 < *ppd) {
                  dVar36 = ppVar25->cmr;
                  if ((dVar36 != -1.0) || (NAN(dVar36))) {
                    if ((dVar36 != 1.0) || (NAN(dVar36))) {
                      if ((dVar36 != 0.0) || (NAN(dVar36))) {
                        uVar12 = this->n_ion_populations;
                        pdVar15 = this->icmr;
                        for (uVar18 = 0; (~((int)uVar12 >> 0x1f) & uVar12) != uVar18;
                            uVar18 = uVar18 + 1) {
                          if ((ppVar25->cmr == pdVar15[uVar18]) &&
                             (!NAN(ppVar25->cmr) && !NAN(pdVar15[uVar18]))) {
                            pdVar13[uVar18 + 3] = ppVar25->q + pdVar13[uVar18 + 3];
                          }
                        }
                      }
                      else {
                        pdVar13[2] = ppVar25->q + pdVar13[2];
                      }
                    }
                    else {
                      pdVar13[1] = ppVar25->q + pdVar13[1];
                    }
                  }
                  else {
                    *pdVar13 = *pdVar13 - ppVar25->q;
                  }
                  ppVar7 = ppVar25->previous;
                  if (ppVar6 != (particle *)0x0) {
                    ppVar6->previous = ppVar7;
                  }
                  if (ppVar7 == (particle *)0x0) {
                    (this->cp).p._M_t.
                    super___uniq_ptr_impl<cellp_**,_std::default_delete<cellp_**[]>_>._M_t.
                    super__Tuple_impl<0UL,_cellp_***,_std::default_delete<cellp_**[]>_>.
                    super__Head_base<0UL,_cellp_***,_false>._M_head_impl[lVar33][lVar20][lVar31].pl.
                    head = ppVar6;
                    pcVar32 = (this->cp).p._M_t.
                              super___uniq_ptr_impl<cellp_**,_std::default_delete<cellp_**[]>_>._M_t
                              .super__Tuple_impl<0UL,_cellp_***,_std::default_delete<cellp_**[]>_>.
                              super__Head_base<0UL,_cellp_***,_false>._M_head_impl[lVar33][lVar20];
                    pcVar32[lVar31].pl.start = pcVar32[lVar31].pl.head;
                  }
                  else {
                    ppVar7->next = ppVar6;
                  }
                  delete_particle(this,ppVar25,false);
                }
              }
            }
          }
        }
        dVar36 = *pdVar14 - *pdVar13;
        if ((dVar36 != 0.0) || (NAN(dVar36))) {
          *pdVar14 = *pdVar14 / dVar36;
        }
        dVar36 = *pdVar27 - pdVar13[1];
        if ((dVar36 != 0.0) || (NAN(dVar36))) {
          *pdVar27 = *pdVar27 / dVar36;
        }
        dVar36 = *pdVar1 - pdVar13[2];
        if ((dVar36 != 0.0) || (NAN(dVar36))) {
          *pdVar1 = *pdVar1 / dVar36;
        }
        uVar18 = (ulong)(uint)(~(this->n_ion_populations >> 0x1f) & this->n_ion_populations);
        for (uVar28 = 0; uVar18 != uVar28; uVar28 = uVar28 + 1) {
          dVar36 = pdVar14[uVar28 + 3] - pdVar13[uVar28 + 3];
          if ((dVar36 != 0.0) || (NAN(dVar36))) {
            pdVar14[uVar28 + 3] = pdVar14[uVar28 + 3] / dVar36;
          }
        }
        uVar11 = this->ny;
        for (uVar28 = 0; uVar28 != (~((int)uVar12 >> 0x1f) & uVar12); uVar28 = uVar28 + 1) {
          uVar26 = this->nz;
          for (uVar29 = 0; uVar29 != (~((int)uVar11 >> 0x1f) & uVar11); uVar29 = uVar29 + 1) {
            pppcVar5 = (this->cp).p._M_t.
                       super___uniq_ptr_impl<cellp_**,_std::default_delete<cellp_**[]>_>._M_t.
                       super__Tuple_impl<0UL,_cellp_***,_std::default_delete<cellp_**[]>_>.
                       super__Head_base<0UL,_cellp_***,_false>._M_head_impl;
            for (uVar24 = 0; uVar24 != (~((int)uVar26 >> 0x1f) & uVar26); uVar24 = uVar24 + 1) {
              pcVar32 = pppcVar5[uVar28][uVar29] + uVar24;
              while (lVar33 = (long)(pcVar32->pl).head, lVar33 != 0) {
                dVar36 = *(double *)(lVar33 + 0x40);
                if ((((dVar36 == -1.0) && (pdVar15 = pdVar14, !NAN(dVar36))) ||
                    ((dVar36 == 1.0 && (pdVar15 = pdVar27, !NAN(dVar36))))) ||
                   ((dVar36 == 0.0 && (pdVar15 = pdVar1, !NAN(dVar36))))) {
                  *(double *)(lVar33 + 0x38) = *pdVar15 * *(double *)(lVar33 + 0x38);
                }
                else {
                  pdVar15 = this->icmr;
                  for (uVar30 = 0; uVar18 != uVar30; uVar30 = uVar30 + 1) {
                    if ((dVar36 == pdVar15[uVar30]) && (!NAN(dVar36) && !NAN(pdVar15[uVar30]))) {
                      *(double *)(lVar33 + 0x38) = pdVar14[uVar30 + 3] * *(double *)(lVar33 + 0x38);
                    }
                  }
                }
                pcVar32 = (cellp *)(lVar33 + 0x58);
              }
            }
          }
        }
      }
      else {
        bVar10 = std::operator==(pmerging,"nl");
        if (bVar10) {
          uVar11 = this->n_ion_populations;
          uVar12 = uVar11 + 3;
          uVar18 = (long)(int)uVar12 * 8;
          if ((int)uVar11 < -3) {
            uVar18 = 0xffffffffffffffff;
          }
          pdVar15 = (double *)operator_new__(uVar18);
          auVar43 = ZEXT1664(ZEXT816(0x3ff0000000000000));
          uVar28 = (ulong)(~((int)uVar12 >> 0x1f) & uVar12);
          for (uVar18 = 0; uVar28 != uVar18; uVar18 = uVar18 + 1) {
            pdVar15[uVar18] = 0.0;
          }
          uVar12 = this->ny;
          uVar26 = this->nx;
          uVar17 = this->nz;
          pdVar23 = pdVar15 + 2;
          pppcVar5 = (this->cp).p._M_t.
                     super___uniq_ptr_impl<cellp_**,_std::default_delete<cellp_**[]>_>._M_t.
                     super__Tuple_impl<0UL,_cellp_***,_std::default_delete<cellp_**[]>_>.
                     super__Head_base<0UL,_cellp_***,_false>._M_head_impl;
          pdVar16 = this->icmr;
          pdVar21 = pdVar15 + 1;
          for (uVar18 = 0; uVar18 != (~((int)uVar26 >> 0x1f) & uVar26); uVar18 = uVar18 + 1) {
            for (uVar29 = 0; uVar29 != (~((int)uVar12 >> 0x1f) & uVar12); uVar29 = uVar29 + 1) {
              for (uVar24 = 0; uVar24 != (~((int)uVar17 >> 0x1f) & uVar17); uVar24 = uVar24 + 1) {
                pcVar32 = pppcVar5[uVar18][uVar29] + uVar24;
                while (lVar33 = (long)(pcVar32->pl).head, lVar33 != 0) {
                  dVar36 = *(double *)(lVar33 + 0x40);
                  if ((((dVar36 == -1.0) && (pdVar22 = pdVar15, !NAN(dVar36))) ||
                      ((dVar36 == 1.0 && (pdVar22 = pdVar21, !NAN(dVar36))))) ||
                     ((dVar36 == 0.0 && (pdVar22 = pdVar23, !NAN(dVar36))))) {
                    *pdVar22 = *pdVar22 + 1.0;
                  }
                  else {
                    for (uVar30 = 0; (~((int)uVar11 >> 0x1f) & uVar11) != uVar30;
                        uVar30 = uVar30 + 1) {
                      if ((dVar36 == pdVar16[uVar30]) && (!NAN(dVar36) && !NAN(pdVar16[uVar30]))) {
                        pdVar15[uVar30 + 3] = pdVar15[uVar30 + 3] + 1.0;
                      }
                    }
                  }
                  pcVar32 = (cellp *)(lVar33 + 0x58);
                }
              }
            }
          }
          for (uVar18 = 0; uVar28 != uVar18; uVar18 = uVar18 + 1) {
            pdVar15[uVar18] = pdVar14[uVar18] / pdVar15[uVar18];
          }
          for (lVar33 = 0; lVar20 = 0, lVar33 < (int)uVar26; lVar33 = lVar33 + 1) {
            for (; lVar20 < (int)uVar12; lVar20 = lVar20 + 1) {
              for (lVar31 = 0; lVar31 < (int)uVar17; lVar31 = lVar31 + 1) {
                ppVar6 = (this->cp).p._M_t.
                         super___uniq_ptr_impl<cellp_**,_std::default_delete<cellp_**[]>_>._M_t.
                         super__Tuple_impl<0UL,_cellp_***,_std::default_delete<cellp_**[]>_>.
                         super__Head_base<0UL,_cellp_***,_false>._M_head_impl[lVar33][lVar20]
                         [lVar31].pl.head;
                while (ppVar25 = ppVar6, ppVar25 != (particle *)0x0) {
                  dVar36 = ppVar25->cmr;
                  ppVar6 = ppVar25->next;
                  if ((dVar36 != -1.0) || (NAN(dVar36))) {
                    if ((dVar36 == auVar43._0_8_) && (!NAN(dVar36) && !NAN(auVar43._0_8_))) {
                      local_90 = get_rand(this);
                      local_88 = ppd[1];
                      dVar36 = ppVar25->q;
                      pdVar16 = pdVar21;
LAB_0012a94a:
                      dVar36 = (dVar36 + dVar36) / *pdVar16;
                      goto LAB_0012a952;
                    }
                    if ((dVar36 == 0.0) && (!NAN(dVar36))) {
                      local_90 = get_rand(this);
                      local_88 = ppd[2];
                      dVar36 = ppVar25->q;
                      pdVar16 = pdVar23;
                      goto LAB_0012a94a;
                    }
                    for (lVar34 = 0; lVar34 < this->n_ion_populations; lVar34 = lVar34 + 1) {
                      if ((ppVar25->cmr == this->icmr[lVar34]) &&
                         (!NAN(ppVar25->cmr) && !NAN(this->icmr[lVar34]))) {
                        dVar37 = get_rand(this);
                        dVar36 = ppd[lVar34 + 3];
                        dVar38 = pow((ppVar25->q + ppVar25->q) / pdVar15[lVar34 + 3],4.0);
                        auVar43 = ZEXT1664(ZEXT816(0x3ff0000000000000));
                        if (dVar37 < (1.0 / (dVar38 + 1.0)) * dVar36) {
                          ppVar7 = ppVar25->next;
                          ppVar8 = ppVar25->previous;
                          if (ppVar7 != (particle *)0x0) {
                            ppVar7->previous = ppVar8;
                          }
                          if (ppVar8 == (particle *)0x0) {
                            (this->cp).p._M_t.
                            super___uniq_ptr_impl<cellp_**,_std::default_delete<cellp_**[]>_>._M_t.
                            super__Tuple_impl<0UL,_cellp_***,_std::default_delete<cellp_**[]>_>.
                            super__Head_base<0UL,_cellp_***,_false>._M_head_impl[lVar33][lVar20]
                            [lVar31].pl.head = ppVar7;
                            pppVar19 = &(this->cp).p._M_t.
                                        super___uniq_ptr_impl<cellp_**,_std::default_delete<cellp_**[]>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_cellp_***,_std::default_delete<cellp_**[]>_>
                                        .super__Head_base<0UL,_cellp_***,_false>._M_head_impl
                                        [lVar33][lVar20][lVar31].pl.start;
                          }
                          else {
                            pppVar19 = &ppVar8->next;
                          }
                          *pppVar19 = ppVar7;
                          delete_particle(this,ppVar25,false);
                          auVar43 = ZEXT1664(ZEXT816(0x3ff0000000000000));
                        }
                      }
                    }
                  }
                  else {
                    local_90 = get_rand(this);
                    local_88 = *ppd;
                    dVar36 = (ppVar25->q * -2.0) / *pdVar15;
LAB_0012a952:
                    dVar36 = pow(dVar36,4.0);
                    auVar43 = ZEXT1664(ZEXT816(0x3ff0000000000000));
                    if (local_90 < (1.0 / (dVar36 + 1.0)) * local_88) {
                      ppVar7 = ppVar25->next;
                      ppVar8 = ppVar25->previous;
                      if (ppVar7 != (particle *)0x0) {
                        ppVar7->previous = ppVar8;
                      }
                      if (ppVar8 == (particle *)0x0) {
                        (this->cp).p._M_t.
                        super___uniq_ptr_impl<cellp_**,_std::default_delete<cellp_**[]>_>._M_t.
                        super__Tuple_impl<0UL,_cellp_***,_std::default_delete<cellp_**[]>_>.
                        super__Head_base<0UL,_cellp_***,_false>._M_head_impl[lVar33][lVar20][lVar31]
                        .pl.head = ppVar7;
                        pppVar19 = &(this->cp).p._M_t.
                                    super___uniq_ptr_impl<cellp_**,_std::default_delete<cellp_**[]>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_cellp_***,_std::default_delete<cellp_**[]>_>
                                    .super__Head_base<0UL,_cellp_***,_false>._M_head_impl[lVar33]
                                    [lVar20][lVar31].pl.start;
                      }
                      else {
                        pppVar19 = &ppVar8->next;
                      }
                      *pppVar19 = ppVar7;
                      delete_particle(this,ppVar25,false);
                      auVar43 = ZEXT1664(ZEXT816(0x3ff0000000000000));
                    }
                  }
                }
                uVar17 = this->nz;
              }
              uVar12 = this->ny;
            }
            uVar26 = this->nx;
          }
          for (; lVar20 < (int)uVar26; lVar20 = lVar20 + 1) {
            for (lVar33 = 0; lVar33 < (int)uVar12; lVar33 = lVar33 + 1) {
              for (lVar31 = 0; lVar31 < (int)uVar17; lVar31 = lVar31 + 1) {
                pcVar32 = (this->cp).p._M_t.
                          super___uniq_ptr_impl<cellp_**,_std::default_delete<cellp_**[]>_>._M_t.
                          super__Tuple_impl<0UL,_cellp_***,_std::default_delete<cellp_**[]>_>.
                          super__Head_base<0UL,_cellp_***,_false>._M_head_impl[lVar20][lVar33] +
                          lVar31;
                while (lVar34 = (long)(pcVar32->pl).head, lVar34 != 0) {
                  dVar36 = *(double *)(lVar34 + 0x40);
                  if ((dVar36 != -1.0) || (NAN(dVar36))) {
                    if ((dVar36 != auVar43._0_8_) || (NAN(dVar36) || NAN(auVar43._0_8_))) {
                      if ((dVar36 != 0.0) || (NAN(dVar36))) {
                        for (lVar35 = 0; lVar35 < this->n_ion_populations; lVar35 = lVar35 + 1) {
                          if ((*(double *)(lVar34 + 0x40) == this->icmr[lVar35]) &&
                             (!NAN(*(double *)(lVar34 + 0x40)) && !NAN(this->icmr[lVar35]))) {
                            dVar36 = *(double *)(lVar34 + 0x38);
                            dVar37 = ppd[lVar35 + 3];
                            dVar38 = pow((dVar36 + dVar36) / pdVar15[lVar35 + 3],4.0);
                            auVar43 = ZEXT1664(ZEXT816(0x3ff0000000000000));
                            auVar42._0_8_ = 1.0 / (dVar38 + 1.0);
                            auVar42._8_8_ = 0;
                            auVar9._8_8_ = 0;
                            auVar9._0_8_ = dVar37;
                            auVar9 = vfnmadd132sd_fma(auVar42,ZEXT816(0x3ff0000000000000),auVar9);
                            dVar36 = dVar36 / auVar9._0_8_;
                            *(double *)(lVar34 + 0x38) = dVar36;
                            pdVar13[lVar35 + 3] = dVar36 + pdVar13[lVar35 + 3];
                          }
                        }
                      }
                      else {
                        dVar36 = *(double *)(lVar34 + 0x38);
                        dVar37 = ppd[2];
                        dVar38 = pow((dVar36 + dVar36) / *pdVar23,4.0);
                        auVar43 = ZEXT1664(ZEXT816(0x3ff0000000000000));
                        auVar41._0_8_ = 1.0 / (dVar38 + 1.0);
                        auVar41._8_8_ = 0;
                        auVar4._8_8_ = 0;
                        auVar4._0_8_ = dVar37;
                        auVar9 = vfnmadd132sd_fma(auVar41,ZEXT816(0x3ff0000000000000),auVar4);
                        dVar36 = dVar36 / auVar9._0_8_;
                        *(double *)(lVar34 + 0x38) = dVar36;
                        pdVar13[2] = dVar36 + pdVar13[2];
                      }
                    }
                    else {
                      dVar36 = *(double *)(lVar34 + 0x38);
                      dVar37 = ppd[1];
                      dVar38 = pow((dVar36 + dVar36) / *pdVar21,4.0);
                      auVar43 = ZEXT1664(ZEXT816(0x3ff0000000000000));
                      auVar40._0_8_ = 1.0 / (dVar38 + 1.0);
                      auVar40._8_8_ = 0;
                      auVar3._8_8_ = 0;
                      auVar3._0_8_ = dVar37;
                      auVar9 = vfnmadd132sd_fma(auVar40,ZEXT816(0x3ff0000000000000),auVar3);
                      dVar36 = dVar36 / auVar9._0_8_;
                      *(double *)(lVar34 + 0x38) = dVar36;
                      pdVar13[1] = dVar36 + pdVar13[1];
                    }
                  }
                  else {
                    dVar36 = *(double *)(lVar34 + 0x38);
                    dVar37 = *ppd;
                    dVar38 = pow((dVar36 * -2.0) / *pdVar15,4.0);
                    auVar43 = ZEXT1664(ZEXT816(0x3ff0000000000000));
                    auVar39._0_8_ = 1.0 / (dVar38 + 1.0);
                    auVar39._8_8_ = 0;
                    auVar2._8_8_ = 0;
                    auVar2._0_8_ = dVar37;
                    auVar9 = vfnmadd132sd_fma(auVar39,ZEXT816(0x3ff0000000000000),auVar2);
                    dVar36 = dVar36 / auVar9._0_8_;
                    *(double *)(lVar34 + 0x38) = dVar36;
                    *pdVar13 = *pdVar13 - dVar36;
                  }
                  pcVar32 = (cellp *)(lVar34 + 0x58);
                }
                uVar17 = this->nz;
              }
              uVar12 = this->ny;
            }
            uVar26 = this->nx;
          }
          uVar11 = this->n_ion_populations;
          uVar17 = 0xfffffffd;
          if (-3 < (int)uVar11) {
            uVar17 = uVar11;
          }
          for (uVar18 = 0; uVar17 + 3 != uVar18; uVar18 = uVar18 + 1) {
            dVar36 = pdVar13[uVar18];
            dVar37 = 0.0;
            if ((dVar36 != 0.0) || (NAN(dVar36))) {
              dVar37 = pdVar14[uVar18] / dVar36;
            }
            pdVar14[uVar18] = dVar37;
          }
          for (uVar18 = 0; uVar18 != (~((int)uVar26 >> 0x1f) & uVar26); uVar18 = uVar18 + 1) {
            uVar17 = this->nz;
            for (uVar28 = 0; uVar28 != (~((int)uVar12 >> 0x1f) & uVar12); uVar28 = uVar28 + 1) {
              pppcVar5 = (this->cp).p._M_t.
                         super___uniq_ptr_impl<cellp_**,_std::default_delete<cellp_**[]>_>._M_t.
                         super__Tuple_impl<0UL,_cellp_***,_std::default_delete<cellp_**[]>_>.
                         super__Head_base<0UL,_cellp_***,_false>._M_head_impl;
              for (uVar29 = 0; uVar29 != (~((int)uVar17 >> 0x1f) & uVar17); uVar29 = uVar29 + 1) {
                pcVar32 = pppcVar5[uVar18][uVar28] + uVar29;
                while (lVar33 = (long)(pcVar32->pl).head, lVar33 != 0) {
                  dVar36 = *(double *)(lVar33 + 0x40);
                  if ((dVar36 != -1.0) || (pdVar23 = pdVar14, NAN(dVar36))) {
                    if (((dVar36 == auVar43._0_8_) &&
                        (pdVar23 = pdVar27, !NAN(dVar36) && !NAN(auVar43._0_8_))) ||
                       ((dVar36 == 0.0 && (pdVar23 = pdVar1, !NAN(dVar36))))) goto LAB_0012aea6;
                    pdVar23 = this->icmr;
                    for (uVar24 = 0; (~((int)uVar11 >> 0x1f) & uVar11) != uVar24;
                        uVar24 = uVar24 + 1) {
                      if ((dVar36 == pdVar23[uVar24]) && (!NAN(dVar36) && !NAN(pdVar23[uVar24]))) {
                        *(double *)(lVar33 + 0x38) =
                             pdVar14[uVar24 + 3] * *(double *)(lVar33 + 0x38);
                      }
                    }
                  }
                  else {
LAB_0012aea6:
                    *(double *)(lVar33 + 0x38) = *pdVar23 * *(double *)(lVar33 + 0x38);
                  }
                  pcVar32 = (cellp *)(lVar33 + 0x58);
                }
              }
            }
          }
          operator_delete__(pdVar15);
        }
      }
      operator_delete__(pdVar13);
      operator_delete__(pdVar14);
      return;
    }
    for (uVar28 = 0; uVar28 != (~((int)uVar26 >> 0x1f) & uVar26); uVar28 = uVar28 + 1) {
      for (uVar29 = 0; uVar29 != (~((int)uVar11 >> 0x1f) & uVar11); uVar29 = uVar29 + 1) {
        pcVar32 = pppcVar5[uVar18][uVar28] + uVar29;
        while (lVar33 = (long)(pcVar32->pl).head, lVar33 != 0) {
          dVar36 = *(double *)(lVar33 + 0x40);
          if ((dVar36 != -1.0) || (NAN(dVar36))) {
            if ((dVar36 != 1.0) || (NAN(dVar36))) {
              if ((dVar36 != 0.0) || (NAN(dVar36))) {
                for (uVar24 = 0; (~((int)uVar12 >> 0x1f) & uVar12) != uVar24; uVar24 = uVar24 + 1) {
                  if ((dVar36 == pdVar15[uVar24]) && (!NAN(dVar36) && !NAN(pdVar15[uVar24]))) {
                    pdVar14[uVar24 + 3] = *(double *)(lVar33 + 0x38) + pdVar14[uVar24 + 3];
                  }
                }
                goto LAB_0012a2c1;
              }
              dVar36 = *(double *)(lVar33 + 0x38);
              pdVar23 = pdVar1;
            }
            else {
              dVar36 = *(double *)(lVar33 + 0x38);
              pdVar23 = pdVar27;
            }
            *pdVar23 = dVar36 + *pdVar23;
          }
          else {
            *pdVar14 = *pdVar14 - *(double *)(lVar33 + 0x38);
          }
LAB_0012a2c1:
          pcVar32 = (cellp *)(lVar33 + 0x58);
        }
      }
    }
    uVar18 = uVar18 + 1;
  } while( true );
}

Assistant:

void spatial_region::pmerging(double* ppd, string pmerging)
{
    /* Из-за флуктуаций отношение удаляемого заряда к полному не равно
     * ppd, поэтому для сохранения нейтральности приходится считать
     * это отношение для каждого сорта частиц отдельно и использовать
     * именно его при при увеличении заряда */
    particle* current;
    particle* tmp;
    double* qs = new double[3+n_ion_populations];
    double* a = new double[3+n_ion_populations];
    for (int i=0;i<3+n_ion_populations;i++) {
        qs[i] = 0;
        a[i] = 0;
    }
    for(int i=0;i<nx;i++) {
        for(int j=0;j<ny;j++) {
            for(int k=0;k<nz;k++) {
                current = cp[i][j][k].pl.head;
                while(current!=0) {
                    if (current->cmr==-1)
                        a[0] -= current->q;
                    else if (current->cmr==1)
                        a[1] += current->q;
                    else if (current->cmr==0)
                        a[2] += current->q;
                    else {
                        for (int ii=0;ii<n_ion_populations;ii++) {
                            if (current->cmr==icmr[ii])
                                a[3+ii] += current->q;
                        }
                    }
                    current = current->next;
                }
            }
        }
    }
    if (pmerging=="ti") {
        for(int i=0;i<nx;i++) {
            for(int j=0;j<ny;j++) {
                for(int k=0;k<nz;k++) {
                    current = cp[i][j][k].pl.head;
                    while(current!=0) {
                        if (get_rand()<ppd[0]) {
                            tmp = current->next;
                            if (current->cmr==-1)
                                qs[0] -= current->q;
                            else if (current->cmr==1)
                                qs[1] += current->q;
                            else if (current->cmr==0)
                                qs[2] += current->q;
                            else {
                                for (int ii=0;ii<n_ion_populations;ii++) {
                                    if (current->cmr==icmr[ii])
                                        qs[3+ii] += current->q;
                                }
                            }
                            //
                            if (current->next!=0)
                                (current->next)->previous = current->previous;
                            //
                            if (current->previous!=0)
                                (current->previous)->next = current->next;
                            else {
                                cp[i][j][k].pl.head = current->next;
                                cp[i][j][k].pl.start = cp[i][j][k].pl.head;
                            }
                            delete_particle(current);
                            //
                            current = tmp;
                        }
                        else
                            current = current->next;
                    }
                }
            }
        }
        //
        if (a[0]-qs[0]!=0)
            a[0] = a[0]/(a[0]-qs[0]);
        if (a[1]-qs[1]!=0)
            a[1] = a[1]/(a[1]-qs[1]);
        if (a[2]-qs[2]!=0)
            a[2] = a[2]/(a[2]-qs[2]);
        for (int i=0;i<n_ion_populations;i++) {
            if (a[3+i]-qs[3+i]!=0)
                a[3+i] = a[3+i]/(a[3+i]-qs[3+i]);
        }
        for(int i=0;i<nx;i++) {
            for(int j=0;j<ny;j++) {
                for(int k=0;k<nz;k++) {
                    current = cp[i][j][k].pl.head;
                    while(current!=0) {
                        if (current->cmr==-1)
                            current->q = a[0]*current->q;
                        else if (current->cmr==1)
                            current->q = a[1]*current->q;
                        else if (current->cmr==0)
                            current->q = a[2]*current->q;
                        else {
                            for (int ii=0;ii<n_ion_populations;ii++) {
                                if (current->cmr==icmr[ii])
                                    current->q = a[3+ii]*current->q;
                            }
                        }
                        current = current->next;
                    }
                }
            }
        }
    } else if (pmerging=="nl") {
        double* av_q = new double[3+n_ion_populations];
        for(int i=0;i<3+n_ion_populations;i++)
            av_q[i] = 0;
        for(int i=0;i<nx;i++) {
            for(int j=0;j<ny;j++) {
                for(int k=0;k<nz;k++) {
                    current = cp[i][j][k].pl.head;
                    while(current!=0) {
                        if (current->cmr==-1)
                            av_q[0] += 1;
                        else if (current->cmr==1)
                            av_q[1] += 1;
                        else if (current->cmr==0)
                            av_q[2] += 1;
                        else {
                            for (int ii=0;ii<n_ion_populations;ii++) {
                                if (current->cmr==icmr[ii])
                                    av_q[3+ii] += 1;
                            }
                        }
                        current = current->next;
                    }
                }
            }
        }
        for (int i=0;i<3+n_ion_populations;i++)
            av_q[i] = a[i]/av_q[i];
        for(int i=0;i<nx;i++) {
            for(int j=0;j<ny;j++) {
                for(int k=0;k<nz;k++) {
                    current = cp[i][j][k].pl.head;
                    while(current!=0) {
                        tmp = current->next;
                        if (current->cmr==-1) {
                            if (get_rand()<ppd[0]*_ppd(-current->q,av_q[0])) {
                                if (current->next!=0)
                                    (current->next)->previous = current->previous;
                                if (current->previous!=0)
                                    (current->previous)->next = current->next;
                                else {
                                    cp[i][j][k].pl.head = current->next;
                                    cp[i][j][k].pl.start = current->next;
                                }
                                delete_particle(current);
                            } 
                        } else if (current->cmr==1) {
                            if (get_rand()<ppd[1]*_ppd(current->q,av_q[1])) {
                                if (current->next!=0)
                                    (current->next)->previous = current->previous;
                                if (current->previous!=0)
                                    (current->previous)->next = current->next;
                                else {
                                    cp[i][j][k].pl.head = current->next;
                                    cp[i][j][k].pl.start = current->next;
                                }
                                delete_particle(current);
                            } 
                        } else if (current->cmr==0) {
                            if (get_rand()<ppd[2]*_ppd(current->q,av_q[2])) {
                                if (current->next!=0)
                                    (current->next)->previous = current->previous;
                                if (current->previous!=0)
                                    (current->previous)->next = current->next;
                                else {
                                    cp[i][j][k].pl.head = current->next;
                                    cp[i][j][k].pl.start = current->next;
                                }
                                delete_particle(current);
                            } 
                        } else {
                            for (int ii=0;ii<n_ion_populations;ii++) {
                                if (current->cmr==icmr[ii]) {
                                    if (get_rand()<ppd[3+ii]*_ppd(current->q,av_q[3+ii])) {
                                        if (current->next!=0)
                                            (current->next)->previous = current->previous;
                                        if (current->previous!=0)
                                            (current->previous)->next = current->next;
                                        else {
                                            cp[i][j][k].pl.head = current->next;
                                            cp[i][j][k].pl.start = current->next;
                                        }
                                        delete_particle(current);
                                    } 
                                }
                            }
                        }
                        current = tmp;
                    }
                }
            }
        }
        for(int i=0;i<nx;i++) {
            for(int j=0;j<ny;j++) {
                for(int k=0;k<nz;k++) {
                    current = cp[i][j][k].pl.head;
                    while(current!=0) {
                        if (current->cmr==-1) {
                            current->q = current->q/(1-ppd[0]*_ppd(-current->q,av_q[0]));
                            qs[0] -= current->q;
                        } else if (current->cmr==1) {
                            current->q = current->q/(1-ppd[1]*_ppd(current->q,av_q[1]));
                            qs[1] += current->q;
                        } else if (current->cmr==0) {
                            current->q = current->q/(1-ppd[2]*_ppd(current->q,av_q[2]));
                            qs[2] += current->q;
                        } else {
                            for (int ii=0;ii<n_ion_populations;ii++) {
                                if (current->cmr==icmr[ii]) {
                                    current->q = current->q/(1-ppd[3+ii]*_ppd(current->q,av_q[3+ii]));
                                    qs[3+ii] += current->q;
                                }
                            }
                        }
                        current = current->next;
                    }
                }
            }
        }
        for(int i=0;i<3+n_ion_populations;i++) {
            if (qs[i]!=0)
                a[i] = a[i]/qs[i];
            else
                a[i] = 0;
        }
        for(int i=0;i<nx;i++) {
            for(int j=0;j<ny;j++) {
                for(int k=0;k<nz;k++) {
                    current = cp[i][j][k].pl.head;
                    while(current!=0) {
                        if (current->cmr==-1)
                            current->q = a[0]*current->q;
                        else if (current->cmr==1)
                            current->q = a[1]*current->q;
                        else if (current->cmr==0)
                            current->q = a[2]*current->q;
                        else {
                            for (int ii=0;ii<n_ion_populations;ii++) {
                                if (current->cmr==icmr[ii])
                                    current->q = a[3+ii]*current->q;
                            }
                        }
                        current = current->next;
                    }
                }
            }
        }
        delete[] av_q;
    }
    delete[] qs;
    delete[] a;
}